

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int testCrypto(void)

{
  bool_t bVar1;
  bool_t bVar2;
  bool_t bVar3;
  bool_t bVar4;
  bool_t bVar5;
  bool_t bVar6;
  bool_t bVar7;
  bool_t bVar8;
  bool_t bVar9;
  bool_t bVar10;
  bool_t bVar11;
  bool_t bVar12;
  bool_t bVar13;
  bool_t bVar14;
  bool_t bVar15;
  bool_t bVar16;
  char *pcVar17;
  char *pcVar18;
  
  bVar1 = beltTest();
  pcVar17 = "OK";
  pcVar18 = "OK";
  if (bVar1 == 0) {
    pcVar18 = "Err";
  }
  printf("beltTest: %s\n",pcVar18);
  bVar2 = bashTest();
  pcVar18 = "OK";
  if (bVar2 == 0) {
    pcVar18 = "Err";
  }
  printf("bashTest: %s\n",pcVar18);
  bVar3 = beltBench();
  bVar4 = bashBench();
  bVar5 = bignTest();
  pcVar18 = "OK";
  if (bVar5 == 0) {
    pcVar18 = "Err";
  }
  printf("bignTest: %s\n",pcVar18);
  bVar6 = bign96Test();
  pcVar18 = "OK";
  if (bVar6 == 0) {
    pcVar18 = "Err";
  }
  printf("bign96Test: %s\n",pcVar18);
  bVar7 = botpTest();
  pcVar18 = "OK";
  if (bVar7 == 0) {
    pcVar18 = "Err";
  }
  printf("botpTest: %s\n",pcVar18);
  bVar8 = brngTest();
  pcVar18 = "OK";
  if (bVar8 == 0) {
    pcVar18 = "Err";
  }
  printf("brngTest: %s\n",pcVar18);
  bVar9 = belsTest();
  pcVar18 = "OK";
  if (bVar9 == 0) {
    pcVar18 = "Err";
  }
  printf("belsTest: %s\n",pcVar18);
  bVar10 = bakeTest();
  pcVar18 = "OK";
  if (bVar10 == 0) {
    pcVar18 = "Err";
  }
  printf("bakeTest: %s\n",pcVar18);
  bVar11 = bpkiTest();
  pcVar18 = "OK";
  if (bVar11 == 0) {
    pcVar18 = "Err";
  }
  printf("bpkiTest: %s\n",pcVar18);
  bVar12 = btokTest();
  pcVar18 = "OK";
  if (bVar12 == 0) {
    pcVar18 = "Err";
  }
  printf("btokTest: %s\n",pcVar18);
  bVar13 = dstuTest();
  pcVar18 = "OK";
  if (bVar13 == 0) {
    pcVar18 = "Err";
  }
  printf("dstuTest: %s\n",pcVar18);
  bVar14 = g12sTest();
  pcVar18 = "OK";
  if (bVar14 == 0) {
    pcVar18 = "Err";
  }
  printf("g12sTest: %s\n",pcVar18);
  bVar15 = pfokTest();
  pcVar18 = "OK";
  if (bVar15 == 0) {
    pcVar18 = "Err";
  }
  printf("pfokTest: %s\n",pcVar18);
  bVar16 = stb99Test();
  if (bVar16 == 0) {
    pcVar17 = "Err";
  }
  printf("stb99Test: %s\n",pcVar17);
  return (uint)((bVar16 == 0 || (bVar15 == 0 || (bVar14 == 0 || (bVar13 == 0 || bVar12 == 0)))) ||
               ((bVar11 == 0 || (bVar10 == 0 || (bVar9 == 0 || bVar8 == 0))) ||
               ((bVar7 == 0 || (bVar6 == 0 || bVar5 == 0)) ||
               ((bVar2 == 0 || bVar1 == 0) || (bVar4 == 0 || bVar3 == 0)))));
}

Assistant:

int testCrypto()
{
	bool_t code;
	int ret = 0;
	printf("beltTest: %s\n", (code = beltTest()) ? "OK" : "Err"), ret |= !code;
	printf("bashTest: %s\n", (code = bashTest()) ? "OK" : "Err"), ret |= !code;
	code = beltBench(), ret |= !code;
	code = bashBench(), ret |= !code;
	printf("bignTest: %s\n", (code = bignTest()) ? "OK" : "Err"), ret |= !code;
	printf("bign96Test: %s\n", (code = bign96Test()) ? "OK" : "Err"),
		ret |= !code;
	printf("botpTest: %s\n", (code = botpTest()) ? "OK" : "Err"), ret |= !code;
	printf("brngTest: %s\n", (code = brngTest()) ? "OK" : "Err"), ret |= !code;
	printf("belsTest: %s\n", (code = belsTest()) ? "OK" : "Err"), ret |= !code;
	printf("bakeTest: %s\n", (code = bakeTest()) ? "OK" : "Err"), ret |= !code;
	printf("bpkiTest: %s\n", (code = bpkiTest()) ? "OK" : "Err"), ret |= !code;
	printf("btokTest: %s\n", (code = btokTest()) ? "OK" : "Err"), ret |= !code;
	printf("dstuTest: %s\n", (code = dstuTest()) ? "OK" : "Err"), ret |= !code;
	printf("g12sTest: %s\n", (code = g12sTest()) ? "OK" : "Err"), ret |= !code;
	printf("pfokTest: %s\n", (code = pfokTest()) ? "OK" : "Err"), ret |= !code;
	printf("stb99Test: %s\n", (code = stb99Test()) ? "OK" : "Err"),
		ret |= !code;
	return ret;
}